

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O2

char * UINT16ToHex(char *s,HPDF_UINT16 val,char *eptr,HPDF_BYTE width)

{
  ushort uVar1;
  ushort uVar2;
  byte bVar3;
  char cVar4;
  undefined8 in_RAX;
  char cVar5;
  char *pcVar6;
  HPDF_BYTE b [2];
  undefined6 uStack_28;
  HPDF_UINT16 val_local;
  HPDF_UINT16 val2;
  
  val2 = (HPDF_UINT16)((ulong)in_RAX >> 0x30);
  uStack_28 = CONCAT24(val,(int)in_RAX);
  if (6 < (long)eptr - (long)s) {
    HPDF_MemCpy(b,(HPDF_BYTE *)&val_local,2);
    uVar1 = (short)b << 8;
    uVar2 = (ushort)b >> 8;
    _uStack_28 = CONCAT26(uVar1 | uVar2,uStack_28);
    HPDF_MemCpy(b,(HPDF_BYTE *)&val2,2);
    *s = '<';
    if (width == '\x02') {
      cVar5 = (b[0] >> 4) + 0x37;
      if (b[0] < 0xa0) {
        cVar5 = (b[0] >> 4) + 0x30;
      }
      s[1] = cVar5;
      bVar3 = b[0] & 0xf;
      cVar5 = bVar3 + 0x37;
      if (bVar3 < 10) {
        cVar5 = bVar3 + 0x30;
      }
      s[2] = cVar5;
      pcVar6 = s + 3;
    }
    else {
      pcVar6 = s + 1;
    }
    cVar5 = (b[1] >> 4) + 0x37;
    if (b[1] < 0xa0) {
      cVar5 = (b[1] >> 4) + 0x30;
    }
    bVar3 = b[1] & 0xf;
    cVar4 = bVar3 + 0x37;
    if (bVar3 < 10) {
      cVar4 = bVar3 + 0x30;
    }
    *pcVar6 = cVar5;
    pcVar6[1] = cVar4;
    pcVar6[2] = '>';
    pcVar6[3] = '\0';
    s = pcVar6 + 3;
  }
  return s;
}

Assistant:

static char*
UINT16ToHex  (char        *s,
              HPDF_UINT16  val,
              char        *eptr,
              HPDF_BYTE    width)
{
    HPDF_BYTE b[2];
    HPDF_UINT16 val2;
    char c;

    if (eptr - s < 7)
        return s;

    /* align byte-order */
    HPDF_MemCpy (b, (HPDF_BYTE *)&val, 2);
    val2 = (HPDF_UINT16)((HPDF_UINT16)b[0] << 8 | (HPDF_UINT16)b[1]);

    HPDF_MemCpy (b, (HPDF_BYTE *)&val2, 2);

    *s++ = '<';

    /*
     * In principle a range of <00> - <1F> can now not be
     * distinguished from <0000> - <001F>..., this seems something
     * that is wrong with CID ranges. For the UCS-2 encoding we need
     * to add <0000> - <FFFF> and this cannot be <00> - <FFFF> (or at
     * least, that crashes Mac OSX Preview).
     */
    if (width == 2) {
        c = b[0] >> 4;
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;

        c = (char)(b[0] & 0x0f);
        if (c <= 9)
            c += 0x30;
        else
            c += 0x41 - 10;
        *s++ = c;
    }

    c = (char)(b[1] >> 4);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    c = (char)(b[1] & 0x0f);
    if (c <= 9)
        c += 0x30;
    else
        c += 0x41 - 10;
    *s++ = c;

    *s++ = '>';
    *s = 0;

    return s;
}